

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

error_code wave::make_error_code(Error err)

{
  error_category *peVar1;
  error_code eVar2;
  undefined8 uStack_10;
  
  switch(err) {
  case kFailedToOpen:
  case kWriteError:
  case kReadError:
    uStack_10 = 5;
    break;
  case kNotOpen:
    uStack_10 = 1;
    break;
  case kInvalidFormat:
    uStack_10 = 8;
    break;
  default:
    uStack_10 = 0;
    peVar1 = (error_category *)std::_V2::system_category();
    goto LAB_0011dc1a;
  }
  peVar1 = (error_category *)std::_V2::generic_category();
LAB_0011dc1a:
  eVar2._M_cat = peVar1;
  eVar2._0_8_ = uStack_10;
  return eVar2;
}

Assistant:

std::error_code make_error_code(Error err) {
  switch (err) {
    case kFailedToOpen:
      return std::make_error_code(std::errc::io_error);
    case kNotOpen:
      return std::make_error_code(std::errc::operation_not_permitted);
    case kInvalidFormat:
      return std::make_error_code(std::errc::executable_format_error);
    case kWriteError:
      return std::make_error_code(std::errc::io_error);
    case kReadError:
      return std::make_error_code(std::errc::io_error);
    default:
      return std::error_code();
  }
}